

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CTState * lj_ctype_init(lua_State *L)

{
  uint uVar1;
  CTState *cts;
  CType *ct;
  size_t lenx;
  GCstr *pGVar2;
  uint uVar3;
  uint uVar4;
  CTInfo *pCVar5;
  char *__s;
  long lVar6;
  
  cts = (CTState *)lj_mem_realloc(L,(void *)0x0,0,0x1d0);
  ct = (CType *)lj_mem_realloc(L,(void *)0x0,0,0x800);
  memset(&cts->g,0,0x1b8);
  cts->tab = ct;
  cts->top = 0x60;
  cts->sizetab = 0x80;
  cts->L = (lua_State *)0x0;
  cts->g = (global_State *)(ulong)(L->glref).ptr32;
  __s = "va_list";
  pCVar5 = lj_ctype_typeinfo;
  for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 1) {
    uVar3 = *pCVar5;
    uVar1 = (int)(short)uVar3 >> 10;
    ct->size = uVar1;
    ct->info = uVar3 & 0xffff03ff;
    ct->sib = 0;
    uVar4 = uVar3 >> 0x1c;
    if ((uVar4 == 0xd) || (uVar4 == 7)) {
      lenx = strlen(__s);
      pGVar2 = lj_str_new(L,__s,lenx);
      pGVar2->marked = pGVar2->marked | 0x20;
      (ct->name).gcptr32 = (uint32_t)pGVar2;
      __s = __s + lenx + 1;
      lj_ctype_addname(cts,ct,(CTypeID)lVar6);
    }
    else {
      (ct->name).gcptr32 = 0;
      ct->next = 0;
      if (uVar4 != 5) {
        uVar3 = (uVar3 & 0xffff03ff ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
        uVar3 = (uVar1 >> 0xd ^ uVar3) - (uVar3 >> 0x13) & 0x7f;
        ct->next = cts->hash[uVar3];
        cts->hash[uVar3] = (CTypeID1)lVar6;
      }
    }
    ct = ct + 1;
    pCVar5 = pCVar5 + 1;
  }
  *(int *)((ulong)(L->glref).ptr32 + 0x194) = (int)cts;
  return cts;
}

Assistant:

CTState *lj_ctype_init(lua_State *L)
{
  CTState *cts = lj_mem_newt(L, sizeof(CTState), CTState);
  CType *ct = lj_mem_newvec(L, CTTYPETAB_MIN, CType);
  const char *name = lj_ctype_typenames;
  CTypeID id;
  memset(cts, 0, sizeof(CTState));
  cts->tab = ct;
  cts->sizetab = CTTYPETAB_MIN;
  cts->top = CTTYPEINFO_NUM;
  cts->L = NULL;
  cts->g = G(L);
  for (id = 0; id < CTTYPEINFO_NUM; id++, ct++) {
    CTInfo info = lj_ctype_typeinfo[id];
    ct->size = (CTSize)((int32_t)(info << 16) >> 26);
    ct->info = info & 0xffff03ffu;
    ct->sib = 0;
    if (ctype_type(info) == CT_KW || ctype_istypedef(info)) {
      size_t len = strlen(name);
      GCstr *str = lj_str_new(L, name, len);
      ctype_setname(ct, str);
      name += len+1;
      lj_ctype_addname(cts, ct, id);
    } else {
      setgcrefnull(ct->name);
      ct->next = 0;
      if (!ctype_isenum(info)) ctype_addtype(cts, ct, id);
    }
  }
  setmref(G(L)->ctype_state, cts);
  return cts;
}